

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_serialize_struct
          (t_lua_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,":write(oprot)");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_lua_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  (void)tstruct;
  indent(out) << prefix << ":write(oprot)" << endl;
}